

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O3

void display_map(int *cy,int *cx)

{
  ulong uVar1;
  monster_race *pmVar2;
  void *pvVar3;
  void *pvVar4;
  loc lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  wchar_t wVar9;
  long lVar10;
  byte bVar11;
  wchar_t wVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  chunk_conflict *pcVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  wchar_t tc;
  wchar_t local_a0;
  wchar_t ta;
  wchar_t local_98;
  wchar_t local_94;
  ulong local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  monster_race *local_70;
  wchar_t *local_68;
  wchar_t *local_60;
  grid_data g;
  
  pmVar2 = r_info;
  local_68 = cy;
  local_60 = cx;
  pvVar3 = mem_zalloc((long)cave->height << 3);
  uVar8 = (ulong)(uint)cave->height;
  if (0 < cave->height) {
    lVar10 = 0;
    do {
      pvVar4 = mem_zalloc((long)cave->width);
      *(void **)((long)pvVar3 + lVar10 * 8) = pvVar4;
      lVar10 = lVar10 + 1;
      uVar8 = (ulong)cave->height;
    } while (lVar10 < (long)uVar8);
  }
  uVar15 = Term->hgt - 2;
  uVar19 = cave->width;
  uVar6 = (uint)uVar8;
  uVar20 = uVar6;
  if (1 < tile_height) {
    iVar14 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                  (long)(int)(uint)tile_height);
    iVar7 = 0;
    if (0 < iVar14) {
      iVar7 = (uint)tile_height - iVar14;
    }
    uVar15 = uVar15 - (int)uVar15 % (int)(uint)tile_height;
    uVar20 = iVar7 + uVar6;
  }
  uVar13 = Term->wid - 2;
  if (1 < tile_width) {
    uVar17 = (uint)tile_width;
    iVar7 = 0;
    if (0 < (int)uVar19 % (int)uVar17) {
      iVar7 = uVar17 - (int)uVar19 % (int)uVar17;
    }
    uVar19 = iVar7 + uVar19;
    uVar13 = uVar13 - (int)uVar13 % (int)uVar17;
  }
  if ((int)uVar15 < (int)uVar20) {
    uVar20 = uVar15;
  }
  local_90 = (ulong)uVar20;
  if ((int)uVar13 < (int)uVar19) {
    uVar19 = uVar13;
  }
  uVar8 = (ulong)uVar19;
  local_80 = uVar8;
  if ((0 < (int)uVar19) && (0 < (int)uVar20)) {
    local_70 = pmVar2;
    local_98 = L'\x01';
    local_a0 = L' ';
    ta = L'\x01';
    tc = L' ';
    wVar9 = uVar20 + L'\x01';
    wVar12 = L'\0';
    local_88 = pvVar3;
    window_make(L'\0',L'\0',uVar19 + L'\x01',wVar9);
    if (uVar19 + L'\x01' < Term->wid + L'\xffffffff') {
      do {
        Term_erase(uVar19 + L'\x02',wVar12,(Term->wid - uVar19) + L'\xfffffffe');
        wVar12 = wVar12 + L'\x01';
      } while (wVar9 != wVar12);
    }
    wVar12 = (int)local_90 + L'\x02';
    if (wVar12 < Term->hgt && wVar9 < Term->hgt + L'\xffffffff') {
      do {
        Term_erase(L'\0',wVar12,Term->wid);
        wVar12 = wVar12 + L'\x01';
      } while (wVar12 < Term->hgt);
    }
    iVar7 = cave->height;
    pcVar18 = cave;
    if (0 < iVar7) {
      iVar14 = 0;
      do {
        uVar1 = (long)(iVar14 * (int)local_90) / (long)iVar7;
        iVar7 = (int)uVar1;
        if (1 < tile_height) {
          iVar7 = iVar7 - (int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)(uint)tile_height);
        }
        iVar16 = pcVar18->width;
        if (0 < iVar16) {
          local_78 = (long)iVar7;
          local_94 = iVar7 + L'\x01';
          iVar22 = 0;
          iVar7 = 0;
          do {
            iVar21 = (int)((long)iVar22 / (long)iVar16);
            if (1 < tile_width) {
              iVar21 = iVar21 - (int)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 |
                                            (long)iVar22 / (long)iVar16 & 0xffffffffU) %
                                     (long)(int)(uint)tile_width);
            }
            lVar5 = (loc)loc(iVar7,iVar14);
            map_info(lVar5,&g);
            grid_data_as_text(&g,&local_98,&local_a0,&ta,&tc);
            if ((local_98 == ta) && (local_a0 == tc)) {
              bVar11 = f_info[g.f_idx].priority;
            }
            else {
              bVar11 = 0x14;
            }
            if (*(byte *)(*(long *)((long)local_88 + local_78 * 8) + (long)iVar21) < bVar11) {
              g.lighting = LIGHTING_LIT;
              grid_data_as_text(&g,&local_98,&local_a0,&ta,&tc);
              Term_queue_char(Term,iVar21 + L'\x01',local_94,local_98,local_a0,ta,tc);
              if ((1 < tile_width) || (1 < tile_height)) {
                Term_big_queue_char(Term,iVar21 + L'\x01',local_94,Term->hgt + L'\xffffffff',L'ÿ',
                                    L'\xffffffff',L'\0',L'\0');
              }
              *(byte *)(*(long *)((long)local_88 + local_78 * 8) + (long)iVar21) = bVar11;
            }
            iVar7 = iVar7 + 1;
            iVar16 = cave->width;
            iVar22 = iVar22 + (int)local_80;
            pcVar18 = cave;
            uVar8 = local_80;
          } while (iVar7 < iVar16);
        }
        uVar19 = (uint)uVar8;
        iVar14 = iVar14 + 1;
        iVar7 = pcVar18->height;
      } while (iVar14 < iVar7);
    }
    uVar8 = (long)((int)local_90 * (player->grid).y) / (long)iVar7;
    iVar7 = (int)uVar8;
    uVar1 = (long)(int)(uVar19 * (player->grid).x) / (long)pcVar18->width;
    iVar14 = (int)uVar1;
    if (1 < tile_width) {
      iVar14 = iVar14 - (int)((long)((ulong)(uint)(iVar14 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                             (long)(int)(uint)tile_width);
    }
    if (1 < tile_height) {
      iVar7 = iVar7 - (int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                           (long)(int)(uint)tile_height);
    }
    lVar5.x = (player->grid).x;
    lVar5.y = (player->grid).y;
    map_info(lVar5,&g);
    g.lighting = LIGHTING_LIT;
    grid_data_as_text(&g,&local_98,&local_a0,&ta,&tc);
    wVar12 = iVar14 + L'\x01';
    wVar9 = iVar7 + L'\x01';
    Term_queue_char(Term,wVar12,wVar9,(uint)monster_x_attr[local_70->ridx],
                    monster_x_char[local_70->ridx],ta,tc);
    if ((1 < tile_width) || (1 < tile_height)) {
      Term_big_queue_char(Term,wVar12,wVar9,Term->hgt + L'\xffffffff',L'ÿ',L'\xffffffff',L'\0',
                          L'\0');
    }
    pvVar3 = local_88;
    if (local_68 != (wchar_t *)0x0) {
      *local_68 = wVar9;
    }
    if (local_60 != (wchar_t *)0x0) {
      *local_60 = wVar12;
    }
    if (0 < cave->height) {
      lVar10 = 0;
      do {
        mem_free(*(void **)((long)pvVar3 + lVar10 * 8));
        lVar10 = lVar10 + 1;
      } while (lVar10 < cave->height);
    }
    mem_free(pvVar3);
    return;
  }
  if (0 < (int)uVar6) {
    lVar10 = 0;
    do {
      mem_free(*(void **)((long)pvVar3 + lVar10 * 8));
      lVar10 = lVar10 + 1;
    } while (lVar10 < cave->height);
  }
  mem_free(pvVar3);
  return;
}

Assistant:

void display_map(int *cy, int *cx)
{
	int map_hgt, map_wid;
	int row, col;

	int x, y;
	struct grid_data g;

	int a, ta;
	wchar_t c, tc;

	uint8_t tp;

	struct monster_race *race = &r_info[0];

	/* Priority array */
	uint8_t **mp = mem_zalloc(cave->height * sizeof(uint8_t*));
	for (y = 0; y < cave->height; y++)
		mp[y] = mem_zalloc(cave->width * sizeof(uint8_t));

	/* Desired map height */
	get_minimap_dimensions(Term, cave, tile_width, tile_height,
		&map_wid, &map_hgt);

	/* Prevent accidents */
	if ((map_wid < 1) || (map_hgt < 1)) {
		for (y = 0; y < cave->height; y++)
			mem_free(mp[y]);
		mem_free(mp);
		return;
	}

	/* Nothing here */
	a = COLOUR_WHITE;
    c = L' ';
	ta = COLOUR_WHITE;
	tc = L' ';

	/* Draw a box around the edge of the term */
	window_make(0, 0, map_wid + 1, map_hgt + 1);

	/* Clear outside that boundary. */
	if (map_wid + 1 < Term->wid - 1) {
		for (y = 0; y < map_hgt + 1; y++) {
			Term_erase(map_wid + 2, y, Term->wid - map_wid - 2);
		}
	}
	if (map_hgt + 1 < Term->hgt - 1) {
		for (y = map_hgt + 2; y < Term->hgt; y++) {
			Term_erase(0, y, Term->wid);
		}
	}

	/* Analyze the actual map */
	for (y = 0; y < cave->height; y++) {
		row = (y * map_hgt) / cave->height;
		if (tile_height > 1) row = row - (row % tile_height);

		for (x = 0; x < cave->width; x++) {
			col = (x * map_wid) / cave->width;
			if (tile_width > 1) col = col - (col % tile_width);

			/* Get the attr/char at that map location */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Get the priority of that attr/char */
			tp = f_info[g.f_idx].priority;

			/* Stuff on top of terrain gets higher priority */
			if ((a != ta) || (c != tc)) tp = 20;

			/* Save "best" */
			if (mp[row][col] < tp) {
				/* Hack - make every grid on the map lit */
				g.lighting = LIGHTING_LIT;
				grid_data_as_text(&g, &a, &c, &ta, &tc);

				Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

				if ((tile_width > 1) || (tile_height > 1))
					Term_big_queue_char(Term, col + 1,
						row + 1, Term->hgt - 1,
						255, -1, 0, 0);

				/* Save priority */
				mp[row][col] = tp;
			}
		}
	}

	/*** Display the player ***/

	/* Player location */
	row = (player->grid.y * map_hgt / cave->height);
	col = (player->grid.x * map_wid / cave->width);

	if (tile_width > 1)
		col = col - (col % tile_width);
	if (tile_height > 1)
		row = row - (row % tile_height);

	/* Get the terrain at the player's spot. */
	map_info(player->grid, &g);
	g.lighting = LIGHTING_LIT;
	grid_data_as_text(&g, &a, &c, &ta, &tc);

	/* Get the "player" tile */
	a = monster_x_attr[race->ridx];
	c = monster_x_char[race->ridx];

	/* Draw the player */
	Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, col + 1, row + 1, Term->hgt - 1,
			255, -1, 0, 0);
  
	/* Return player location */
	if (cy != NULL) (*cy) = row + 1;
	if (cx != NULL) (*cx) = col + 1;

	for (y = 0; y < cave->height; y++)
		mem_free(mp[y]);
	mem_free(mp);
}